

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
despot::Parser::ComputeState
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Parser *this,int index)

{
  pointer piVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  pointer *ppbVar6;
  int iVar7;
  allocator_type local_19;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             ((long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->curr_state_vars_).
                    super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                    super__Vector_impl_data._M_start >> 6) * -0x5555555555555555,&local_19);
  piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) - 1;
  if (-1 < (int)uVar3) {
    ppbVar6 = (pointer *)
              ((long)&(this->curr_state_vars_).
                      super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar3].super_NamedVar.super_Variable.
                      values_ + 8);
    lVar4 = (ulong)uVar3 + 1;
    do {
      iVar7 = (int)((ulong)((long)*ppbVar6 - (long)((_Vector_impl_data *)(ppbVar6 + -1))->_M_start)
                   >> 5);
      piVar1[lVar4 + -1] = index % iVar7;
      ppbVar6 = ppbVar6 + -0x18;
      lVar5 = lVar4 + -1;
      bVar2 = 0 < lVar4;
      lVar4 = lVar5;
      index = index / iVar7;
    } while (lVar5 != 0 && bVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Parser::ComputeState(int index) const {
	vector<int> state(curr_state_vars_.size());
	for (int s = state.size() - 1; s >= 0; s--) {
		state[s] = index % curr_state_vars_[s].Size();
		index /= curr_state_vars_[s].Size();
	}

	return state;
}